

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O2

void __thiscall
OpenMD::ThermoIntegrationForceModifier::modifyForces(ThermoIntegrationForceModifier *this)

{
  Snapshot *this_00;
  Molecule *pMVar1;
  pointer ppSVar2;
  StuntDouble *this_01;
  RealType RVar3;
  RealType RVar4;
  double pe;
  double dVar5;
  MoleculeIterator mi;
  Vector3d trq;
  Vector3d frc;
  Mat3x3d tempTau;
  MoleculeIterator local_f8;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_f8._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_f0);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_78);
  pMVar1 = SimInfo::beginMolecule
                     ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_f8);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001fe11c;
    this_01 = (StuntDouble *)0x0;
    while (this_01 != (StuntDouble *)0x0) {
      StuntDouble::getFrc((Vector3d *)&local_c0,this_01);
      Vector<double,_3U>::operator=(&local_d8,(Vector<double,_3U> *)&local_c0);
      Vector<double,_3U>::mul(&local_d8,this->factor_);
      StuntDouble::setFrc(this_01,(Vector3d *)&local_d8);
      if (this_01->objType_ - otDAtom < 2) {
        StuntDouble::getTrq((Vector3d *)&local_c0,this_01);
        Vector<double,_3U>::operator=(&local_f0,(Vector<double,_3U> *)&local_c0);
        Vector<double,_3U>::mul(&local_f0,this->factor_);
        StuntDouble::setTrq(this_01,(Vector3d *)&local_f0);
      }
      ppSVar2 = ppSVar2 + 1;
      this_01 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001fe11c:
        this_01 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule
                       ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_f8);
  }
  this_00 = ((this->super_RestraintForceModifier).super_ForceModifier.info_)->sman_->
            currentSnapshot_;
  RVar3 = Snapshot::getPotentialEnergy(this_00);
  Snapshot::setRawPotential(this_00,RVar3);
  RVar4 = Snapshot::getRestraintPotential(this_00);
  pe = RVar3 * this->factor_;
  Snapshot::setPotentialEnergy(this_00,pe);
  Snapshot::getVirialTensor((Mat3x3d *)&local_c0,this_00);
  RectMatrix<double,_3U,_3U>::operator=(&local_78,&local_c0);
  RectMatrix<double,_3U,_3U>::mul(&local_78,this->factor_);
  Snapshot::setVirialTensor(this_00,(Mat3x3d *)&local_78);
  dVar5 = 0.0;
  RVar3 = 0.0;
  if ((this->simParam_->UseRestraints).super_ParameterBase.field_0x2b == '\x01') {
    dVar5 = RestraintForceModifier::doRestraints
                      (&this->super_RestraintForceModifier,1.0 - this->factor_);
    RVar3 = (this->super_RestraintForceModifier).unscaledPotential_;
  }
  Snapshot::setPotentialEnergy(this_00,pe + dVar5);
  Snapshot::setRestraintPotential(this_00,RVar4 + RVar3);
  return;
}

Assistant:

void ThermoIntegrationForceModifier::modifyForces() {
    Snapshot* curSnapshot;
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;
    Vector3d frc;
    Vector3d trq;
    Mat3x3d tempTau;

    // now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        frc = sd->getFrc();
        frc *= factor_;
        sd->setFrc(frc);

        if (sd->isDirectional()) {
          trq = sd->getTrq();
          trq *= factor_;
          sd->setTrq(trq);
        }
      }
    }

    curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // set rawPotential to be the unscaled potential energy
    RealType rawPot = curSnapshot->getPotentialEnergy();
    curSnapshot->setRawPotential(rawPot);

    RealType rp = curSnapshot->getRestraintPotential();

    // scale the potential and update the snapshot
    rawPot *= factor_;
    curSnapshot->setPotentialEnergy(rawPot);

    // scale the virial tensor
    tempTau = curSnapshot->getVirialTensor();
    tempTau *= factor_;
    curSnapshot->setVirialTensor(tempTau);

    // now, on to the applied restraining potentials (if needed):
    RealType scaledRestPot(0.0);
    RealType restPot(0.0);

    if (simParam_->getUseRestraints()) {
      // do restraints from RestraintForceModifier:
      scaledRestPot = doRestraints(1.0 - factor_);
      restPot       = getUnscaledPotential();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &scaledRestPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // give the final values to the snapshot
    curSnapshot->setPotentialEnergy(rawPot + scaledRestPot);
    curSnapshot->setRestraintPotential(rp + restPot);
  }